

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

void nvrm_munmap(uint32_t id,uint64_t mmap_addr,uint64_t len,uint64_t mmap_offset)

{
  gpu_object *local_38;
  cpu_mapping *cpu_mapping;
  gpu_object *obj;
  uint64_t mmap_offset_local;
  uint64_t len_local;
  uint64_t mmap_addr_local;
  uint32_t id_local;
  
  cpu_mapping = (cpu_mapping *)gpu_objects;
  do {
    if (cpu_mapping == (cpu_mapping *)0x0) {
      if ((dump_sys_munmap != 0) && (fprintf(_stdout,"\n"), mmt_sync_fd != -1)) {
        fflush(_stdout);
      }
      buffer_munmap(id);
      return;
    }
    for (local_38 = cpu_mapping->object; local_38 != (gpu_object *)0x0;
        local_38 = (gpu_object *)(local_38->written_regions).last) {
      if (local_38->children_objects == (gpu_object **)mmap_addr) {
        if ((dump_sys_munmap != 0) && (local_38->handle == FDNVIDIA)) {
          fprintf(_stdout,", cid: 0x%08x, handle: 0x%08x",(ulong)(uint)cpu_mapping->fd,
                  (ulong)cpu_mapping->fdtype);
          describe_nvrm_object(cpu_mapping->fd,cpu_mapping->fdtype,"");
        }
        disconnect_cpu_mapping_from_gpu_object((cpu_mapping *)local_38);
        break;
      }
    }
    cpu_mapping = *(cpu_mapping **)&(cpu_mapping->ib).entries;
  } while( true );
}

Assistant:

void nvrm_munmap(uint32_t id, uint64_t mmap_addr, uint64_t len, uint64_t mmap_offset)
{
	struct gpu_object *obj;
	struct cpu_mapping *cpu_mapping;

	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		for (cpu_mapping = obj->cpu_mappings; cpu_mapping != NULL; cpu_mapping = cpu_mapping->next)
			if (cpu_mapping->cpu_addr == mmap_addr)
			{
				if (dump_sys_munmap)
				{
					if (cpu_mapping->fdtype == FDNVIDIA)
					{
						mmt_log_cont(", cid: 0x%08x, handle: 0x%08x", obj->cid, obj->handle);
						describe_nvrm_object(obj->cid, obj->handle, "");
					}
				}

				disconnect_cpu_mapping_from_gpu_object(cpu_mapping);
				break;
			}

	if (dump_sys_munmap)
		mmt_log_cont_nl();

	buffer_munmap(id);
}